

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opusfile.c
# Opt level: O0

int op_fetch_headers(OggOpusFile *_of,OpusHead *_head,OpusTags *_tags,ogg_uint32_t **_serialnos,
                    int *_nserialnos,int *_cserialnos,ogg_page *_og)

{
  int iVar1;
  opus_int64 oVar2;
  long local_78;
  undefined1 local_60 [4];
  int ret;
  ogg_page og;
  int *_cserialnos_local;
  int *_nserialnos_local;
  ogg_uint32_t **_serialnos_local;
  OpusTags *_tags_local;
  OpusHead *_head_local;
  OggOpusFile *_of_local;
  
  og.body_len = (long)_cserialnos;
  if (_og == (ogg_page *)0x0) {
    if (_of->offset < 0x7ffffffffffeffff) {
      local_78 = _of->offset;
    }
    else {
      local_78 = 0x7ffffffffffeffff;
    }
    oVar2 = op_get_next_page(_of,(ogg_page *)local_60,local_78 + 0x10000);
    if (oVar2 < 0) {
      return -0x84;
    }
    _og = (ogg_page *)local_60;
  }
  _of->ready_state = 2;
  iVar1 = op_fetch_headers_impl(_of,_head,_tags,_serialnos,_nserialnos,(int *)og.body_len,_og);
  if (iVar1 < 0) {
    _of->ready_state = 2;
  }
  return iVar1;
}

Assistant:

static int op_fetch_headers(OggOpusFile *_of,OpusHead *_head,
 OpusTags *_tags,ogg_uint32_t **_serialnos,int *_nserialnos,
 int *_cserialnos,ogg_page *_og){
  ogg_page og;
  int      ret;
  if(!_og){
    /*No need to clamp the boundary offset against _of->end, as all errors
       become OP_ENOTFORMAT.*/
    if(OP_UNLIKELY(op_get_next_page(_of,&og,
     OP_ADV_OFFSET(_of->offset,OP_CHUNK_SIZE))<0)){
      return OP_ENOTFORMAT;
    }
    _og=&og;
  }
  _of->ready_state=OP_OPENED;
  ret=op_fetch_headers_impl(_of,_head,_tags,_serialnos,_nserialnos,
   _cserialnos,_og);
  /*Revert back from OP_STREAMSET to OP_OPENED on failure, to prevent
     double-free of the tags in an unseekable stream.*/
  if(OP_UNLIKELY(ret<0))_of->ready_state=OP_OPENED;
  return ret;
}